

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

int * vrna_idx_row_wise(uint length)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  piVar1 = (int *)vrna_alloc(length * 4 + 4);
  if (length != 0) {
    uVar3 = 1;
    uVar2 = length;
    do {
      piVar1[uVar3] = (uVar2 * (uVar2 - 1) >> 1) + length + 1;
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (length + 1 != uVar3);
  }
  return piVar1;
}

Assistant:

PUBLIC int *
vrna_idx_row_wise(unsigned int length)
{
  int i;
  int *idx = (int *)vrna_alloc(sizeof(int) * (length + 1));

  for (i = 1; i <= length; i++)
    idx[i] = (((length + 1 - i) * (length - i)) / 2) + length + 1;
  return idx;
}